

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O0

asn_enc_rval_t *
INTEGER_encode_uper(asn_TYPE_descriptor_t *td,asn_per_constraints_t *constraints,void *sptr,
                   asn_per_outp_t *po)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  ulong *in_RCX;
  asn_per_constraints_t *in_RDX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  bool bVar6;
  asn_enc_rval_t *tmp_error;
  ssize_t mayEncode;
  unsigned_long uval;
  int inext;
  unsigned_long v;
  long value;
  asn_per_constraint_t *ct;
  uint8_t *end;
  uint8_t *buf;
  INTEGER_t *st;
  asn_enc_rval_t er;
  asn_INTEGER_specifics_t *specs;
  undefined8 in_stack_ffffffffffffff08;
  uint8_t *in_stack_ffffffffffffff10;
  asn_per_outp_t *in_stack_ffffffffffffff18;
  unsigned_long *in_stack_ffffffffffffff20;
  asn_per_outp_t *in_stack_ffffffffffffff28;
  long *in_stack_ffffffffffffff30;
  INTEGER_t *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  char *pcVar7;
  asn_per_outp_t *in_stack_ffffffffffffff48;
  char *local_b0;
  asn_per_constraints_t *local_a8;
  char *local_a0;
  ulong local_80;
  ulong local_68;
  asn_per_constraints_t *local_60;
  ulong local_50;
  asn_per_constraints_t *local_10;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_68 = 0;
  if ((in_RCX == (ulong *)0x0) || ((int)in_RCX[1] == 0)) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = in_RCX;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      local_a0 = "";
    }
    else {
      local_a0 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_a0);
    return in_RDI;
  }
  local_10 = in_RDX;
  if (in_RDX == (asn_per_constraints_t *)0x0) {
    local_10 = in_RSI->per_constraints;
  }
  if (local_10 == (asn_per_constraints_t *)0x0) {
    local_a8 = (asn_per_constraints_t *)0x0;
  }
  else {
    local_a8 = local_10;
  }
  local_60 = local_a8;
  if (local_a8 != (asn_per_constraints_t *)0x0) {
    bVar6 = false;
    if ((in_RSI->specifics == (void *)0x0) || (*(int *)((long)in_RSI->specifics + 0x20) == 0)) {
      iVar3 = asn_INTEGER2long(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if (iVar3 != 0) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = in_RSI;
        in_RDI->structure_ptr = in_RCX;
        if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = in_RSI->name;
        }
        ASN_DEBUG("Failed to encode element %s",pcVar7);
        return in_RDI;
      }
      if (((local_a8->value).flags & APC_SEMI_CONSTRAINED) == APC_UNCONSTRAINED) {
        if ((-1 < (local_a8->value).range_bits) &&
           ((0 < (local_a8->value).lower_bound || ((local_a8->value).upper_bound < 0)))) {
          bVar6 = true;
        }
      }
      else {
        bVar6 = 0 < (local_a8->value).lower_bound;
      }
      ASN_DEBUG("Value %ld (%02x/%d) lb %ld ub %ld %s",0,(ulong)*(byte *)*in_RCX,
                (ulong)(uint)in_RCX[1],(local_a8->value).lower_bound,(local_a8->value).upper_bound);
    }
    else {
      iVar3 = asn_INTEGER2ulong((INTEGER_t *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      if (iVar3 != 0) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = in_RSI;
        in_RDI->structure_ptr = in_RCX;
        if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
          local_b0 = "";
        }
        else {
          local_b0 = in_RSI->name;
        }
        ASN_DEBUG("Failed to encode element %s",local_b0);
        return in_RDI;
      }
      if (((local_a8->value).flags & APC_SEMI_CONSTRAINED) == APC_UNCONSTRAINED) {
        if ((-1 < (local_a8->value).range_bits) &&
           ((local_80 < (ulong)(local_a8->value).lower_bound ||
            ((ulong)(local_a8->value).upper_bound < local_80)))) {
          bVar6 = true;
        }
      }
      else {
        bVar6 = local_80 < (ulong)(local_a8->value).lower_bound;
      }
      ASN_DEBUG("Value %lu (%02x/%d) lb %lu ub %lu %s",local_80,(ulong)*(byte *)*in_RCX,
                (ulong)(uint)in_RCX[1],(local_a8->value).lower_bound,(local_a8->value).upper_bound);
      local_68 = local_80;
    }
    iVar3 = 0;
    if (((local_a8->value).flags & APC_EXTENSIBLE) == APC_UNCONSTRAINED) {
      if (bVar6) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = in_RSI;
        in_RDI->structure_ptr = in_RCX;
        if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = in_RSI->name;
        }
        ASN_DEBUG("Failed to encode element %s",pcVar7);
        return in_RDI;
      }
    }
    else {
      iVar4 = per_put_few_bits(in_stack_ffffffffffffff48,
                               (uint32_t)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                               (int)in_stack_ffffffffffffff40);
      if (iVar4 != 0) {
        in_RDI->encoded = -1;
        in_RDI->failed_type = in_RSI;
        in_RDI->structure_ptr = in_RCX;
        if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = in_RSI->name;
        }
        ASN_DEBUG("Failed to encode element %s",pcVar7);
        return in_RDI;
      }
      if (bVar6) {
        local_60 = (asn_per_constraints_t *)0x0;
      }
    }
  }
  if ((local_60 == (asn_per_constraints_t *)0x0) || ((local_60->value).range_bits < 0)) {
    if ((local_60 == (asn_per_constraints_t *)0x0) || ((local_60->value).lower_bound == 0)) {
      uVar1 = *in_RCX;
      uVar2 = in_RCX[1];
      for (local_50 = *in_RCX; local_50 < uVar1 + (long)(int)uVar2; local_50 = sVar5 + local_50) {
        sVar5 = uper_put_length(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        if (sVar5 < 0) {
          in_RDI->encoded = -1;
          in_RDI->failed_type = in_RSI;
          in_RDI->structure_ptr = in_RCX;
          if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = in_RSI->name;
          }
          ASN_DEBUG("Failed to encode element %s",pcVar7);
          return in_RDI;
        }
        iVar4 = per_put_many_bits(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,iVar3);
        if (iVar4 != 0) {
          in_RDI->encoded = -1;
          in_RDI->failed_type = in_RSI;
          in_RDI->structure_ptr = in_RCX;
          if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = in_RSI->name;
          }
          ASN_DEBUG("Failed to encode element %s",pcVar7);
          return in_RDI;
        }
      }
      in_RDI->encoded = 0;
      in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
      in_RDI->structure_ptr = (void *)0x0;
    }
    else {
      ASN_DEBUG("Adjust lower bound to %ld",(local_60->value).lower_bound);
      in_RDI->encoded = -1;
      in_RDI->failed_type = in_RSI;
      in_RDI->structure_ptr = in_RCX;
      if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = in_RSI->name;
      }
      ASN_DEBUG("Failed to encode element %s",pcVar7);
    }
  }
  else {
    ASN_DEBUG("Encoding integer %ld (%lu) with range %d bits",local_68,
              local_68 - (local_60->value).lower_bound,(ulong)(uint)(local_60->value).range_bits);
    iVar3 = uper_put_constrained_whole_number_u
                      (in_stack_ffffffffffffff18,(unsigned_long)in_stack_ffffffffffffff10,iVar3);
    if (iVar3 == 0) {
      in_RDI->encoded = 0;
      in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
      in_RDI->structure_ptr = (void *)0x0;
    }
    else {
      in_RDI->encoded = -1;
      in_RDI->failed_type = in_RSI;
      in_RDI->structure_ptr = in_RCX;
      if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = in_RSI->name;
      }
      ASN_DEBUG("Failed to encode element %s",pcVar7);
    }
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
INTEGER_encode_uper(asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_enc_rval_t er;
	INTEGER_t *st = (INTEGER_t *)sptr;
	const uint8_t *buf;
	const uint8_t *end;
	asn_per_constraint_t *ct;
	long value = 0;
	unsigned long v = 0;

	if(!st || st->size == 0) ASN__ENCODE_FAILED;

	if(!constraints) constraints = td->per_constraints;
	ct = constraints ? &constraints->value : 0;

	er.encoded = 0;

	if(ct) {
		int inext = 0;
		if(specs && specs->field_unsigned) {
			unsigned long uval;
			if(asn_INTEGER2ulong(st, &uval))
				ASN__ENCODE_FAILED;
			/* Check proper range */
			if(ct->flags & APC_SEMI_CONSTRAINED) {
				if(uval < (unsigned long)ct->lower_bound)
					inext = 1;
			} else if(ct->range_bits >= 0) {
				if(uval < (unsigned long)ct->lower_bound
				|| uval > (unsigned long)ct->upper_bound)
					inext = 1;
			}
			ASN_DEBUG("Value %lu (%02x/%d) lb %lu ub %lu %s",
				uval, st->buf[0], st->size,
				ct->lower_bound, ct->upper_bound,
				inext ? "ext" : "fix");
			value = uval;
		} else {
			if(asn_INTEGER2long(st, &value))
				ASN__ENCODE_FAILED;
			/* Check proper range */
			if(ct->flags & APC_SEMI_CONSTRAINED) {
				if(value < ct->lower_bound)
					inext = 1;
			} else if(ct->range_bits >= 0) {
				if(value < ct->lower_bound
				|| value > ct->upper_bound)
					inext = 1;
			}
			ASN_DEBUG("Value %ld (%02x/%d) lb %ld ub %ld %s",
				value, st->buf[0], st->size,
				ct->lower_bound, ct->upper_bound,
				inext ? "ext" : "fix");
		}
		if(ct->flags & APC_EXTENSIBLE) {
			if(per_put_few_bits(po, inext, 1))
				ASN__ENCODE_FAILED;
			if(inext) ct = 0;
		} else if(inext) {
			ASN__ENCODE_FAILED;
		}
	}


	/* X.691-11/2008, #13.2.2, test if constrained whole number */
	if(ct && ct->range_bits >= 0) {
		/* #11.5.6 -> #11.3 */
		ASN_DEBUG("Encoding integer %ld (%lu) with range %d bits",
			value, value - ct->lower_bound, ct->range_bits);
		v = value - ct->lower_bound;
		if(uper_put_constrained_whole_number_u(po, v, ct->range_bits))
			ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	if(ct && ct->lower_bound) {
		ASN_DEBUG("Adjust lower bound to %ld", ct->lower_bound);
		/* TODO: adjust lower bound */
		ASN__ENCODE_FAILED;
	}

	for(buf = st->buf, end = st->buf + st->size; buf < end;) {
		ssize_t mayEncode = uper_put_length(po, end - buf);
		if(mayEncode < 0)
			ASN__ENCODE_FAILED;
		if(per_put_many_bits(po, buf, 8 * mayEncode))
			ASN__ENCODE_FAILED;
		buf += mayEncode;
	}

	ASN__ENCODED_OK(er);
}